

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

iterator __thiscall
ska::detailv3::
sherwood_v3_table<const_slang::syntax::DefineDirectiveSyntax_*,_const_slang::syntax::DefineDirectiveSyntax_*,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>_>
::find(sherwood_v3_table<const_slang::syntax::DefineDirectiveSyntax_*,_const_slang::syntax::DefineDirectiveSyntax_*,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>_>
       *this,DefineDirectiveSyntax **key)

{
  bool bVar1;
  size_t sVar2;
  iterator iVar3;
  char local_31;
  EntryPointer psStack_30;
  int8_t distance;
  EntryPointer it;
  size_t index;
  DefineDirectiveSyntax **key_local;
  sherwood_v3_table<const_slang::syntax::DefineDirectiveSyntax_*,_const_slang::syntax::DefineDirectiveSyntax_*,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>_>
  *this_local;
  
  sVar2 = sherwood_v3_table<slang::syntax::DefineDirectiveSyntax_const*,slang::syntax::DefineDirectiveSyntax_const*,std::hash<slang::syntax::DefineDirectiveSyntax_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::DefineDirectiveSyntax_const*>>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::DefineDirectiveSyntax_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::DefineDirectiveSyntax_const*>,8ul>>
          ::hash_object<slang::syntax::DefineDirectiveSyntax_const*>
                    ((sherwood_v3_table<slang::syntax::DefineDirectiveSyntax_const*,slang::syntax::DefineDirectiveSyntax_const*,std::hash<slang::syntax::DefineDirectiveSyntax_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::DefineDirectiveSyntax_const*>>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::DefineDirectiveSyntax_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::DefineDirectiveSyntax_const*>,8ul>>
                      *)this,key);
  sVar2 = fibonacci_hash_policy::index_for_hash(&this->hash_policy,sVar2,this->num_slots_minus_one);
  psStack_30 = this->entries + sVar2;
  local_31 = '\0';
  while( true ) {
    if (psStack_30->distance_from_desired < local_31) {
      iVar3 = end(this);
      return (iterator)iVar3.current;
    }
    bVar1 = sherwood_v3_table<slang::syntax::DefineDirectiveSyntax_const*,slang::syntax::DefineDirectiveSyntax_const*,std::hash<slang::syntax::DefineDirectiveSyntax_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::DefineDirectiveSyntax_const*>>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::DefineDirectiveSyntax_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::DefineDirectiveSyntax_const*>,8ul>>
            ::
            compares_equal<slang::syntax::DefineDirectiveSyntax_const*,slang::syntax::DefineDirectiveSyntax_const*>
                      ((sherwood_v3_table<slang::syntax::DefineDirectiveSyntax_const*,slang::syntax::DefineDirectiveSyntax_const*,std::hash<slang::syntax::DefineDirectiveSyntax_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::DefineDirectiveSyntax_const*>>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::DefineDirectiveSyntax_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::DefineDirectiveSyntax_const*>,8ul>>
                        *)this,key,&(psStack_30->field_1).value);
    if (bVar1) break;
    local_31 = local_31 + '\x01';
    psStack_30 = psStack_30 + 1;
  }
  templated_iterator<const_slang::syntax::DefineDirectiveSyntax_*>::templated_iterator
            ((templated_iterator<const_slang::syntax::DefineDirectiveSyntax_*> *)&this_local,
             psStack_30);
  return (iterator)(EntryPointer)this_local;
}

Assistant:

iterator find(const FindKey & key)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer it = entries + ptrdiff_t(index);
        for (int8_t distance = 0; it->distance_from_desired >= distance; ++distance, ++it)
        {
            if (compares_equal(key, it->value))
                return { it };
        }
        return end();
    }